

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_CutDsdBalanceEvalInt
              (If_DsdMan_t *p,int iDsd,int *pTimes,Vec_Int_t *vAig,int *pArea,char *pPermLits)

{
  int *p_00;
  If_DsdMan_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int Res;
  int nSuppAll;
  int iLit;
  int nSupp;
  char *pPermLits_local;
  int *pArea_local;
  Vec_Int_t *vAig_local;
  int *pTimes_local;
  If_DsdMan_t *pIStack_18;
  int iDsd_local;
  If_DsdMan_t *p_local;
  
  nSuppAll = 0;
  Res = 0;
  _iLit = pPermLits;
  pPermLits_local = (char *)pArea;
  pArea_local = &vAig->nCap;
  vAig_local = (Vec_Int_t *)pTimes;
  pTimes_local._4_4_ = iDsd;
  pIStack_18 = p;
  iVar1 = If_DsdVecLitSuppSize(&p->vObjs,iDsd);
  p_01 = pIStack_18;
  iVar2 = Abc_Lit2Var(pTimes_local._4_4_);
  iVar2 = If_CutDsdBalanceEval_rec
                    (p_01,iVar2,&vAig_local->nCap,&nSuppAll,(Vec_Int_t *)pArea_local,&Res,iVar1,
                     (int *)pPermLits_local,_iLit);
  if (iVar2 == -1) {
    p_local._4_4_ = -1;
  }
  else {
    if (nSuppAll != iVar1) {
      __assert_fail("nSupp == nSuppAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                    ,0x90b,
                    "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                   );
    }
    if (pArea_local != (int *)0x0) {
      iVar3 = Abc_Lit2Var(Res);
      iVar1 = nSuppAll;
      iVar4 = Vec_IntSize((Vec_Int_t *)pArea_local);
      iVar4 = Abc_Lit2Var(iVar4);
      if (iVar3 != iVar1 + iVar4 + -1) {
        __assert_fail("vAig == NULL || Abc_Lit2Var(iLit) == nSupp + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                      ,0x90c,
                      "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                     );
      }
    }
    p_00 = pArea_local;
    if (pArea_local != (int *)0x0) {
      uVar5 = Abc_LitIsCompl(Res);
      uVar6 = Abc_LitIsCompl(pTimes_local._4_4_);
      Vec_IntPush((Vec_Int_t *)p_00,uVar5 ^ uVar6);
    }
    p_local._4_4_ = iVar2;
    if ((pArea_local != (int *)0x0) &&
       (uVar5 = Vec_IntSize((Vec_Int_t *)pArea_local), (uVar5 & 1) == 0)) {
      __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                    ,0x90f,
                    "int If_CutDsdBalanceEvalInt(If_DsdMan_t *, int, int *, Vec_Int_t *, int *, char *)"
                   );
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutDsdBalanceEvalInt( If_DsdMan_t * p, int iDsd, int * pTimes, Vec_Int_t * vAig, int * pArea, char * pPermLits )
{
    int nSupp = 0, iLit = 0;
    int nSuppAll = If_DsdVecLitSuppSize( &p->vObjs, iDsd );
    int Res = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iDsd), pTimes, &nSupp, vAig, &iLit, nSuppAll, pArea, pPermLits );
    if ( Res == -1 )
        return -1;
    assert( nSupp == nSuppAll );
    assert( vAig == NULL || Abc_Lit2Var(iLit) == nSupp + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(iDsd) );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}